

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

void * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::put_transaction<Msg>::try_raw_allocate
          (put_transaction<Msg> *this,progress_guarantee i_progress_guarantee,size_t i_size,
          size_t i_alignment)

{
  Allocation push_data;
  Allocation local_38;
  
  if ((this->m_put).m_user_storage == (void *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,599);
  }
  detail::
  LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  ::try_inplace_allocate
            (&local_38,
             (LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
              *)this->m_queue,i_progress_guarantee,2,false,i_size,i_alignment);
  return local_38.m_user_storage;
}

Assistant:

void * try_raw_allocate(
              progress_guarantee i_progress_guarantee, size_t i_size, size_t i_alignment) noexcept
            {
                DENSITY_ASSERT(!empty());
                auto push_data = m_queue->try_inplace_allocate(
                  i_progress_guarantee, detail::LfQueue_Dead, false, i_size, i_alignment);
                return push_data.m_user_storage;
            }